

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

MessageType __thiscall
cmMakefile::ExpandVariablesInStringNew
          (cmMakefile *this,string *errorstr,string *source,bool escapeQuotes,bool noEscapes,
          bool atOnly,char *filename,long line,bool replaceAt)

{
  t_domain tVar1;
  long lVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  cmValue cVar6;
  byte *pbVar7;
  undefined8 uVar8;
  cmListFileContext *pcVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  size_t sVar11;
  ostream *poVar12;
  long *plVar13;
  undefined7 in_register_00000009;
  ulong *puVar14;
  ulong uVar15;
  ulong uVar16;
  byte *pbVar17;
  undefined7 in_register_00000081;
  undefined3 in_register_00000089;
  byte *pbVar18;
  uint uVar19;
  byte *pbVar20;
  byte bVar21;
  string_view str;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view str_00;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  string varresult;
  vector<t_lookup,_std::allocator<t_lookup>_> openstack;
  string result;
  string svalue;
  string variable;
  string local_2c8;
  string *local_2a8;
  string local_2a0;
  cmMakefile *local_280;
  MessageType local_274;
  ulong local_270;
  t_lookup *local_268;
  iterator iStack_260;
  t_lookup *local_258;
  undefined1 *local_248;
  size_t local_240;
  undefined1 local_238;
  undefined7 uStack_237;
  undefined4 local_224;
  ulong local_220;
  string local_218;
  unsigned_long local_1f8;
  undefined4 local_1f0;
  undefined4 local_1ec;
  string *local_1e8;
  cmListFileBacktrace *local_1e0;
  RegularExpression *local_1d8;
  cmState *local_1d0;
  undefined1 local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8 [6];
  ios_base local_158 [264];
  string local_50;
  
  local_1f0 = CONCAT31(in_register_00000089,atOnly);
  local_1ec = (undefined4)CONCAT71(in_register_00000081,noEscapes);
  local_224 = (undefined4)CONCAT71(in_register_00000009,escapeQuotes);
  pbVar17 = (byte *)(source->_M_dataplus)._M_p;
  local_248 = &local_238;
  local_240 = 0;
  local_238 = 0;
  local_2a8 = errorstr;
  local_1e8 = source;
  std::__cxx11::string::reserve((ulong)&local_248);
  local_268 = (t_lookup *)0x0;
  iStack_260._M_current = (t_lookup *)0x0;
  local_258 = (t_lookup *)0x0;
  local_1d0 = (this->GlobalGenerator->CMakeInstance->State)._M_t.
              super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
              super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
              super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  if ((ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
       ::lineVar_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                                   ::lineVar_abi_cxx11_), iVar5 != 0)) {
    ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
    ::lineVar_abi_cxx11_._M_dataplus._M_p =
         (pointer)&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                   ::lineVar_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                ::lineVar_abi_cxx11_,"CMAKE_CURRENT_LIST_LINE","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                  ::lineVar_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                         ::lineVar_abi_cxx11_);
  }
  local_270 = line;
  bVar21 = *pbVar17;
  local_1d8 = &this->cmNamedCurly;
  local_1e0 = &this->Backtrace;
  local_274 = LOG;
  local_220 = 0;
  pbVar20 = pbVar17;
  local_280 = this;
  do {
    if (bVar21 < 0x40) {
      if (bVar21 == 10) {
        local_270 = local_270 + 1;
      }
      else {
        if (bVar21 != 0x24) {
          if (bVar21 != 0) goto LAB_002a4049;
          if ((local_220 & 1) != 0) goto LAB_002a49e1;
          break;
        }
        if ((char)local_1f0 != '\0') goto LAB_002a3ed2;
        local_218._M_dataplus._M_p = local_218._M_dataplus._M_p & 0xffffffff00000000;
        local_218._M_string_length = 0;
        pbVar18 = pbVar17 + 1;
        bVar21 = pbVar17[1];
        if (bVar21 == 0) {
          std::__cxx11::string::append((char *)&local_248,(ulong)pbVar20);
          pbVar20 = pbVar18;
        }
        else if (bVar21 != 0x3c) {
          if (bVar21 == 0x7b) {
            pbVar18 = pbVar17 + 2;
          }
          else {
            local_1c8._0_8_ = strlen((char *)pbVar18);
            __str._M_str = "ENV{";
            __str._M_len = 4;
            local_1c8._8_8_ = pbVar18;
            iVar5 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                              ((basic_string_view<char,_std::char_traits<char>_> *)local_1c8,0,4,
                               __str);
            if (iVar5 == 0) {
              pbVar18 = pbVar17 + 5;
              local_218._M_dataplus._M_p._0_4_ = 1;
            }
            else {
              local_1c8._0_8_ = strlen((char *)pbVar18);
              __str_00._M_str = "CACHE{";
              __str_00._M_len = 6;
              local_1c8._8_8_ = pbVar18;
              iVar5 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                ((basic_string_view<char,_std::char_traits<char>_> *)local_1c8,0,6,
                                 __str_00);
              if (iVar5 != 0) {
                bVar4 = cmsys::RegularExpression::find
                                  (local_1d8,(char *)pbVar18,&local_1d8->regmatch);
                if (bVar4) {
                  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_2a0,pbVar18,
                             pbVar18 + ((long)(local_280->cmNamedCurly).regmatch.endp[0] -
                                       (long)(local_280->cmNamedCurly).regmatch.searchstring));
                  plVar13 = (long *)std::__cxx11::string::replace
                                              ((ulong)&local_2a0,0,(char *)0x0,0x75a97b);
                  puVar14 = (ulong *)(plVar13 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar13 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)puVar14) {
                    local_2c8.field_2._M_allocated_capacity = *puVar14;
                    local_2c8.field_2._8_8_ = plVar13[3];
                    local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
                  }
                  else {
                    local_2c8.field_2._M_allocated_capacity = *puVar14;
                    local_2c8._M_dataplus._M_p = (pointer)*plVar13;
                  }
                  local_2c8._M_string_length = plVar13[1];
                  *plVar13 = (long)puVar14;
                  plVar13[1] = 0;
                  *(undefined1 *)(plVar13 + 2) = 0;
                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_2c8);
                  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(plVar13 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar13 == paVar10) {
                    local_1b8[0]._0_8_ = paVar10->_M_allocated_capacity;
                    local_1b8[0]._8_8_ = plVar13[3];
                    local_1c8._0_8_ = local_1b8;
                  }
                  else {
                    local_1b8[0]._0_8_ = paVar10->_M_allocated_capacity;
                    local_1c8._0_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)*plVar13;
                  }
                  local_1c8._8_8_ = plVar13[1];
                  *plVar13 = (long)paVar10;
                  plVar13[1] = 0;
                  *(undefined1 *)(plVar13 + 2) = 0;
                  std::__cxx11::string::operator=((string *)local_2a8,(string *)local_1c8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c8._0_8_ != local_1b8) {
                    operator_delete((void *)local_1c8._0_8_,local_1b8[0]._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
                    operator_delete(local_2c8._M_dataplus._M_p,
                                    local_2c8.field_2._M_allocated_capacity + 1);
                  }
                  paVar10 = &local_2a0.field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2a0._M_dataplus._M_p != paVar10) {
                    operator_delete(local_2a0._M_dataplus._M_p,
                                    CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                                             local_2a0.field_2._M_local_buf[0]) + 1);
                    paVar10 = extraout_RAX;
                  }
                  local_274 = FATAL_ERROR;
                  local_220 = CONCAT71((int7)((ulong)paVar10 >> 8),1);
                }
                goto LAB_002a49a6;
              }
              pbVar18 = pbVar17 + 7;
              local_218._M_dataplus._M_p._0_4_ = 2;
            }
          }
          std::__cxx11::string::append((char *)&local_248,(ulong)pbVar20);
          local_218._M_string_length = local_240;
          pbVar17 = pbVar18 + -1;
          pbVar20 = pbVar18;
          if (iStack_260._M_current == local_258) {
            std::vector<t_lookup,std::allocator<t_lookup>>::_M_realloc_insert<t_lookup_const&>
                      ((vector<t_lookup,std::allocator<t_lookup>> *)&local_268,iStack_260,
                       (t_lookup *)&local_218);
          }
          else {
            *(pointer *)iStack_260._M_current = local_218._M_dataplus._M_p;
            (iStack_260._M_current)->loc = local_240;
            iStack_260._M_current = iStack_260._M_current + 1;
          }
        }
      }
    }
    else if (bVar21 == 0x40) {
      if (replaceAt) {
        pbVar18 = pbVar17 + 1;
        pbVar7 = (byte *)strchr((char *)pbVar18,0x40);
        if ((pbVar7 != pbVar18 && pbVar7 != (byte *)0x0) &&
           (sVar11 = strspn((char *)pbVar18,
                            "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789/_.+-"),
           pbVar7 == pbVar18 + sVar11)) {
          local_1c8._0_8_ = local_1b8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1c8,pbVar18,pbVar18 + ~(ulong)pbVar17 + (long)pbVar7);
          local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
          local_2c8._M_string_length = 0;
          local_2c8.field_2._M_allocated_capacity =
               local_2c8.field_2._M_allocated_capacity & 0xffffffffffffff00;
          if (((filename == (char *)0x0) ||
              (local_1c8._8_8_ !=
               ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
               ::lineVar_abi_cxx11_._M_string_length)) ||
             (((byte *)local_1c8._8_8_ != (byte *)0x0 &&
              (iVar5 = bcmp((void *)local_1c8._0_8_,
                            ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                            ::lineVar_abi_cxx11_._M_dataplus._M_p,local_1c8._8_8_), iVar5 != 0)))) {
            cVar6 = GetDefinition(local_280,(string *)local_1c8);
            if (cVar6.Value == (string *)0x0) {
              if (local_280->SuppressSideEffects == false) {
                MaybeWarnUninitialized(local_280,(string *)local_1c8,filename);
              }
            }
            else {
              std::__cxx11::string::_M_assign((string *)&local_2c8);
            }
          }
          else {
            local_1f8 = -local_270;
            if (0 < (long)local_270) {
              local_1f8 = local_270;
            }
            uVar19 = 1;
            if (9 < local_1f8) {
              uVar15 = local_1f8;
              uVar3 = 4;
              do {
                uVar19 = uVar3;
                if (uVar15 < 100) {
                  uVar19 = uVar19 - 2;
                  goto LAB_002a4748;
                }
                if (uVar15 < 1000) {
                  uVar19 = uVar19 - 1;
                  goto LAB_002a4748;
                }
                if (uVar15 < 10000) goto LAB_002a4748;
                bVar4 = 99999 < uVar15;
                uVar15 = uVar15 / 10000;
                uVar3 = uVar19 + 4;
              } while (bVar4);
              uVar19 = uVar19 + 1;
            }
LAB_002a4748:
            lVar2 = (long)local_270 >> 0x3f;
            local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_2a0,(char)uVar19 - (char)((long)local_270 >> 0x3f));
            std::__detail::__to_chars_10_impl<unsigned_long>
                      (local_2a0._M_dataplus._M_p + -lVar2,uVar19,local_1f8);
            std::__cxx11::string::operator=((string *)&local_2c8,(string *)&local_2a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
              operator_delete(local_2a0._M_dataplus._M_p,
                              CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                                       local_2a0.field_2._M_local_buf[0]) + 1);
            }
          }
          if ((char)local_224 != '\0') {
            str_00._M_str = local_2c8._M_dataplus._M_p;
            str_00._M_len = local_2c8._M_string_length;
            cmEscapeQuotes_abi_cxx11_(&local_2a0,str_00);
            std::__cxx11::string::operator=((string *)&local_2c8,(string *)&local_2a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
              operator_delete(local_2a0._M_dataplus._M_p,
                              CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                                       local_2a0.field_2._M_local_buf[0]) + 1);
            }
          }
          std::__cxx11::string::append((char *)&local_248,(ulong)pbVar20);
          std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_2c8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
            operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._0_8_ != local_1b8) {
            operator_delete((void *)local_1c8._0_8_,local_1b8[0]._M_allocated_capacity + 1);
          }
          pbVar17 = pbVar7;
          pbVar20 = pbVar7 + 1;
          goto LAB_002a49a6;
        }
      }
LAB_002a4049:
      if (((local_268 != iStack_260._M_current) && (iVar5 = isalnum((int)(char)bVar21), iVar5 == 0))
         && ((uVar19 = bVar21 - 0x2b, 0x34 < uVar19 ||
             ((0x1000000000001dU >> ((ulong)uVar19 & 0x3f) & 1) == 0)))) {
        std::__cxx11::string::append((char *)local_2a8);
        std::__cxx11::string::push_back((char)local_2a8);
        std::__cxx11::string::append((char *)&local_248,(ulong)pbVar20);
        std::__cxx11::string::substr((ulong)&local_2a0,(ulong)&local_248);
        plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_2a0,0,(char *)0x0,0x75aa50);
        puVar14 = (ulong *)(plVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar14) {
          local_2c8.field_2._M_allocated_capacity = *puVar14;
          local_2c8.field_2._8_8_ = plVar13[3];
          local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
        }
        else {
          local_2c8.field_2._M_allocated_capacity = *puVar14;
          local_2c8._M_dataplus._M_p = (pointer)*plVar13;
        }
        local_2c8._M_string_length = plVar13[1];
        *plVar13 = (long)puVar14;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_2c8);
        local_1c8._0_8_ = local_1b8;
        paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar13 == paVar10) {
          local_1b8[0]._0_8_ = paVar10->_M_allocated_capacity;
          local_1b8[0]._8_8_ = plVar13[3];
        }
        else {
          local_1b8[0]._0_8_ = paVar10->_M_allocated_capacity;
          local_1c8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar13;
        }
        local_1c8._8_8_ = plVar13[1];
        *plVar13 = (long)paVar10;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_2a8,local_1c8._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._0_8_ != local_1b8) {
          operator_delete((void *)local_1c8._0_8_,local_1b8[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
          operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
          operator_delete(local_2a0._M_dataplus._M_p,
                          CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                                   local_2a0.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_002a49e1;
      }
    }
    else if (bVar21 == 0x5c) {
LAB_002a3ed2:
      if ((char)local_1ec != '\0') goto LAB_002a49a6;
      bVar21 = pbVar17[1];
      if (bVar21 < 0x72) {
        if (bVar21 == 0x3b) {
          if (local_268 == iStack_260._M_current) goto LAB_002a43ea;
        }
        else if (bVar21 == 0x6e) {
          std::__cxx11::string::append((char *)&local_248,(ulong)pbVar20);
          std::__cxx11::string::append((char *)&local_248);
          goto LAB_002a4264;
        }
LAB_002a4200:
        iVar5 = isalnum((int)(char)bVar21);
        if ((bVar21 == 0) || (iVar5 != 0)) {
          uVar8 = std::__cxx11::string::append((char *)local_2a8);
          if (bVar21 != 0) {
            uVar8 = std::__cxx11::string::push_back((char)local_2a8);
          }
          local_220 = CONCAT71((int7)((ulong)uVar8 >> 8),1);
          std::__cxx11::string::append((char *)local_2a8);
        }
        else {
          std::__cxx11::string::append((char *)&local_248,(ulong)pbVar20);
          pbVar20 = pbVar17 + 1;
        }
      }
      else {
        if (bVar21 == 0x72) {
          std::__cxx11::string::append((char *)&local_248,(ulong)pbVar20);
          std::__cxx11::string::append((char *)&local_248);
        }
        else {
          if (bVar21 != 0x74) goto LAB_002a4200;
          std::__cxx11::string::append((char *)&local_248,(ulong)pbVar20);
          std::__cxx11::string::append((char *)&local_248);
        }
LAB_002a4264:
        pbVar20 = pbVar17 + 2;
      }
LAB_002a43ea:
      if (*pbVar20 != 0) {
        pbVar17 = pbVar17 + 1;
      }
    }
    else {
      if (bVar21 != 0x7d) goto LAB_002a4049;
      if (local_268 == iStack_260._M_current) goto LAB_002a49a6;
      tVar1 = iStack_260._M_current[-1].domain;
      uVar15 = iStack_260._M_current[-1].loc;
      iStack_260._M_current = iStack_260._M_current + -1;
      std::__cxx11::string::append((char *)&local_248,(ulong)pbVar20);
      std::__cxx11::string::substr((ulong)&local_2c8,(ulong)&local_248);
      local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
      local_2a0._M_string_length = 0;
      local_2a0.field_2._M_local_buf[0] = '\0';
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      local_218._M_string_length = 0;
      local_218.field_2._M_local_buf[0] = '\0';
      if (tVar1 == NORMAL) {
        if (((filename != (char *)0x0) &&
            (local_2c8._M_string_length ==
             ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
             ::lineVar_abi_cxx11_._M_string_length)) &&
           ((local_2c8._M_string_length == 0 ||
            (iVar5 = bcmp(local_2c8._M_dataplus._M_p,
                          ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                          ::lineVar_abi_cxx11_._M_dataplus._M_p,local_2c8._M_string_length),
            iVar5 == 0)))) {
          pcVar9 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                             (&local_1e0->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                             );
          if ((pcVar9->DeferId).
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged == true) {
            local_1b8[0]._8_8_ =
                 (pcVar9->DeferId).
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._M_value._M_dataplus._M_p;
            local_1b8[0]._0_8_ =
                 (pcVar9->DeferId).
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._M_value._M_string_length;
            local_1c8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x9;
            local_1c8._8_8_ = "DEFERRED:";
            views._M_len = 2;
            views._M_array = (iterator)local_1c8;
            cmCatViews_abi_cxx11_(&local_50,views);
            std::__cxx11::string::operator=((string *)&local_2a0,(string *)&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            local_1f8 = -local_270;
            if (0 < (long)local_270) {
              local_1f8 = local_270;
            }
            uVar19 = 1;
            if (9 < local_1f8) {
              uVar16 = local_1f8;
              uVar3 = 4;
              do {
                uVar19 = uVar3;
                if (uVar16 < 100) {
                  uVar19 = uVar19 - 2;
                  goto LAB_002a487f;
                }
                if (uVar16 < 1000) {
                  uVar19 = uVar19 - 1;
                  goto LAB_002a487f;
                }
                if (uVar16 < 10000) goto LAB_002a487f;
                bVar4 = 99999 < uVar16;
                uVar16 = uVar16 / 10000;
                uVar3 = uVar19 + 4;
              } while (bVar4);
              uVar19 = uVar19 + 1;
            }
LAB_002a487f:
            lVar2 = (long)local_270 >> 0x3f;
            local_1c8._0_8_ = local_1b8;
            std::__cxx11::string::_M_construct
                      ((ulong)local_1c8,(char)uVar19 - (char)((long)local_270 >> 0x3f));
            std::__detail::__to_chars_10_impl<unsigned_long>
                      ((char *)(local_1c8._0_8_ + -lVar2),uVar19,local_1f8);
            std::__cxx11::string::operator=((string *)&local_2a0,(string *)local_1c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._0_8_ != local_1b8) {
              operator_delete((void *)local_1c8._0_8_,local_1b8[0]._M_allocated_capacity + 1);
            }
          }
          goto LAB_002a4903;
        }
        cVar6 = GetDefinition(local_280,&local_2c8);
LAB_002a4187:
        if (cVar6.Value == (string *)0x0) goto LAB_002a4903;
LAB_002a4190:
        if ((char)local_224 == '\0') {
          std::__cxx11::string::_M_assign((string *)&local_2a0);
        }
        else {
          str._M_str = ((cVar6.Value)->_M_dataplus)._M_p;
          str._M_len = (cVar6.Value)->_M_string_length;
          cmEscapeQuotes_abi_cxx11_((string *)local_1c8,str);
          std::__cxx11::string::operator=((string *)&local_2a0,(string *)local_1c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._0_8_ != local_1b8) {
            operator_delete((void *)local_1c8._0_8_,local_1b8[0]._M_allocated_capacity + 1);
          }
        }
      }
      else {
        if (tVar1 == ENVIRONMENT) {
          bVar4 = cmsys::SystemTools::GetEnv(&local_2c8,&local_218);
          cVar6.Value = &local_218;
          if (bVar4) goto LAB_002a4190;
        }
        else if (tVar1 == CACHE) {
          cVar6 = cmState::GetCacheEntryValue(local_1d0,&local_2c8);
          goto LAB_002a4187;
        }
LAB_002a4903:
        if (local_280->SuppressSideEffects == false) {
          MaybeWarnUninitialized(local_280,&local_2c8,filename);
        }
      }
      std::__cxx11::string::replace
                ((ulong)&local_248,uVar15,(char *)(local_240 - uVar15),
                 (ulong)local_2a0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,
                        CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                                 local_218.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p,
                        CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                                 local_2a0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
      }
      pbVar20 = pbVar17 + 1;
    }
LAB_002a49a6:
    if ((local_220 & 1) != 0) goto LAB_002a49e1;
    bVar21 = pbVar17[1];
    pbVar17 = pbVar17 + 1;
  } while (bVar21 != 0);
  if (local_268 == iStack_260._M_current) {
    std::__cxx11::string::append((char *)&local_248);
    std::__cxx11::string::_M_assign((string *)local_1e8);
  }
  else {
    std::__cxx11::string::append((char *)local_2a8);
LAB_002a49e1:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"Syntax error in cmake code ",0x1b);
    if (filename != (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"at\n",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"  ",2);
      sVar11 = strlen(filename);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,filename,sVar11);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
      poVar12 = std::ostream::_M_insert<long>((long)local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"when parsing string\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"  ",2);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1c8,(local_1e8->_M_dataplus)._M_p,
                         local_1e8->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,(local_2a8->_M_dataplus)._M_p,local_2a8->_M_string_length);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)local_2a8,(string *)&local_2c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    std::ios_base::~ios_base(local_158);
    local_274 = FATAL_ERROR;
  }
  if (local_268 != (t_lookup *)0x0) {
    operator_delete(local_268,(long)local_258 - (long)local_268);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248,CONCAT71(uStack_237,local_238) + 1);
  }
  return local_274;
}

Assistant:

MessageType cmMakefile::ExpandVariablesInStringNew(
  std::string& errorstr, std::string& source, bool escapeQuotes,
  bool noEscapes, bool atOnly, const char* filename, long line,
  bool replaceAt) const
{
  // This method replaces ${VAR} and @VAR@ where VAR is looked up
  // with GetDefinition(), if not found in the map, nothing is expanded.
  // It also supports the $ENV{VAR} syntax where VAR is looked up in
  // the current environment variables.

  const char* in = source.c_str();
  const char* last = in;
  std::string result;
  result.reserve(source.size());
  std::vector<t_lookup> openstack;
  bool error = false;
  bool done = false;
  MessageType mtype = MessageType::LOG;

  cmState* state = this->GetCMakeInstance()->GetState();

  static const std::string lineVar = "CMAKE_CURRENT_LIST_LINE";
  do {
    char inc = *in;
    switch (inc) {
      case '}':
        if (!openstack.empty()) {
          t_lookup var = openstack.back();
          openstack.pop_back();
          result.append(last, in - last);
          std::string const& lookup = result.substr(var.loc);
          cmValue value = nullptr;
          std::string varresult;
          std::string svalue;
          switch (var.domain) {
            case NORMAL:
              if (filename && lookup == lineVar) {
                cmListFileContext const& top = this->Backtrace.Top();
                if (top.DeferId) {
                  varresult = cmStrCat("DEFERRED:"_s, *top.DeferId);
                } else {
                  varresult = std::to_string(line);
                }
              } else {
                value = this->GetDefinition(lookup);
              }
              break;
            case ENVIRONMENT:
              if (cmSystemTools::GetEnv(lookup, svalue)) {
                value = cmValue(svalue);
              }
              break;
            case CACHE:
              value = state->GetCacheEntryValue(lookup);
              break;
          }
          // Get the string we're meant to append to.
          if (value) {
            if (escapeQuotes) {
              varresult = cmEscapeQuotes(*value);
            } else {
              varresult = *value;
            }
          } else if (!this->SuppressSideEffects) {
            this->MaybeWarnUninitialized(lookup, filename);
          }
          result.replace(var.loc, result.size() - var.loc, varresult);
          // Start looking from here on out.
          last = in + 1;
        }
        break;
      case '$':
        if (!atOnly) {
          t_lookup lookup;
          const char* next = in + 1;
          const char* start = nullptr;
          char nextc = *next;
          if (nextc == '{') {
            // Looking for a variable.
            start = in + 2;
            lookup.domain = NORMAL;
          } else if (nextc == '<') {
          } else if (!nextc) {
            result.append(last, next - last);
            last = next;
          } else if (cmHasLiteralPrefix(next, "ENV{")) {
            // Looking for an environment variable.
            start = in + 5;
            lookup.domain = ENVIRONMENT;
          } else if (cmHasLiteralPrefix(next, "CACHE{")) {
            // Looking for a cache variable.
            start = in + 7;
            lookup.domain = CACHE;
          } else {
            if (this->cmNamedCurly.find(next)) {
              errorstr = "Syntax $" +
                std::string(next, this->cmNamedCurly.end()) +
                "{} is not supported.  Only ${}, $ENV{}, "
                "and $CACHE{} are allowed.";
              mtype = MessageType::FATAL_ERROR;
              error = true;
            }
          }
          if (start) {
            result.append(last, in - last);
            last = start;
            in = start - 1;
            lookup.loc = result.size();
            openstack.push_back(lookup);
          }
          break;
        }
        CM_FALLTHROUGH;
      case '\\':
        if (!noEscapes) {
          const char* next = in + 1;
          char nextc = *next;
          if (nextc == 't') {
            result.append(last, in - last);
            result.append("\t");
            last = next + 1;
          } else if (nextc == 'n') {
            result.append(last, in - last);
            result.append("\n");
            last = next + 1;
          } else if (nextc == 'r') {
            result.append(last, in - last);
            result.append("\r");
            last = next + 1;
          } else if (nextc == ';' && openstack.empty()) {
            // Handled in ExpandListArgument; pass the backslash literally.
          } else if (isalnum(nextc) || nextc == '\0') {
            errorstr += "Invalid character escape '\\";
            if (nextc) {
              errorstr += nextc;
              errorstr += "'.";
            } else {
              errorstr += "' (at end of input).";
            }
            error = true;
          } else {
            // Take what we've found so far, skipping the escape character.
            result.append(last, in - last);
            // Start tracking from the next character.
            last = in + 1;
          }
          // Skip the next character since it was escaped, but don't read past
          // the end of the string.
          if (*last) {
            ++in;
          }
        }
        break;
      case '\n':
        // Onto the next line.
        ++line;
        break;
      case '\0':
        done = true;
        break;
      case '@':
        if (replaceAt) {
          const char* nextAt = strchr(in + 1, '@');
          if (nextAt && nextAt != in + 1 &&
              nextAt ==
                in + 1 +
                  strspn(in + 1,
                         "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                         "abcdefghijklmnopqrstuvwxyz"
                         "0123456789/_.+-")) {
            std::string variable(in + 1, nextAt - in - 1);

            std::string varresult;
            if (filename && variable == lineVar) {
              varresult = std::to_string(line);
            } else {
              cmValue def = this->GetDefinition(variable);
              if (def) {
                varresult = *def;
              } else if (!this->SuppressSideEffects) {
                this->MaybeWarnUninitialized(variable, filename);
              }
            }

            if (escapeQuotes) {
              varresult = cmEscapeQuotes(varresult);
            }
            // Skip over the variable.
            result.append(last, in - last);
            result.append(varresult);
            in = nextAt;
            last = in + 1;
            break;
          }
        }
        // Failed to find a valid @ expansion; treat it as literal.
        CM_FALLTHROUGH;
      default: {
        if (!openstack.empty() &&
            !(isalnum(inc) || inc == '_' || inc == '/' || inc == '.' ||
              inc == '+' || inc == '-')) {
          errorstr += "Invalid character (\'";
          errorstr += inc;
          result.append(last, in - last);
          errorstr += "\') in a variable name: "
                      "'" +
            result.substr(openstack.back().loc) + "'";
          mtype = MessageType::FATAL_ERROR;
          error = true;
        }
        break;
      }
    }
    // Look at the next character.
  } while (!error && !done && *++in);

  // Check for open variable references yet.
  if (!error && !openstack.empty()) {
    // There's an open variable reference waiting.  Policy CMP0010 flags
    // whether this is an error or not.  The new parser now enforces
    // CMP0010 as well.
    errorstr += "There is an unterminated variable reference.";
    error = true;
  }

  if (error) {
    std::ostringstream emsg;
    emsg << "Syntax error in cmake code ";
    if (filename) {
      // This filename and line number may be more specific than the
      // command context because one command invocation can have
      // arguments on multiple lines.
      emsg << "at\n"
           << "  " << filename << ":" << line << "\n";
    }
    emsg << "when parsing string\n"
         << "  " << source << "\n";
    emsg << errorstr;
    mtype = MessageType::FATAL_ERROR;
    errorstr = emsg.str();
  } else {
    // Append the rest of the unchanged part of the string.
    result.append(last);

    source = result;
  }

  return mtype;
}